

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::MaxViewportDimsTestCase::test
          (MaxViewportDimsTestCase *this)

{
  StateVerifier *pSVar1;
  TestContext *pTVar2;
  uint uVar3;
  uint uVar4;
  RenderTarget *pRVar5;
  MaxViewportDimsTestCase *this_local;
  
  pSVar1 = this->m_verifier;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar5 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  uVar3 = tcu::RenderTarget::getWidth(pRVar5);
  pRVar5 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  uVar4 = tcu::RenderTarget::getHeight(pRVar5);
  (*pSVar1->_vptr_StateVerifier[7])(pSVar1,pTVar2,0xd3a,(ulong)uVar3,(ulong)uVar4);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyIntegerGreaterOrEqual2(m_testCtx, GL_MAX_VIEWPORT_DIMS, m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
		expectError(GL_NO_ERROR);
	}